

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O3

void google::protobuf::internal::DefaultLogHandler
               (LogLevel_conflict level,char *filename,int line,string *message)

{
  if ((int)level < 0) {
    return;
  }
  fprintf(_stderr,"[libprotobuf %s %s:%d] %s\n",
          _ZZN6google8protobuf8internal17DefaultLogHandlerENS0_8LogLevelEPKciRKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEEE11level_names_rel
          + *(int *)(
                    _ZZN6google8protobuf8internal17DefaultLogHandlerENS0_8LogLevelEPKciRKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEEE11level_names_rel
                    + (ulong)level * 4),filename,(ulong)(uint)line,(message->_M_dataplus)._M_p);
  fflush(_stderr);
  return;
}

Assistant:

void DefaultLogHandler(LogLevel level, const char* filename, int line,
                       const string& message) {
  if (level < GOOGLE_PROTOBUF_MIN_LOG_LEVEL) {
    return;
  }
  static const char* level_names[] = { "INFO", "WARNING", "ERROR", "FATAL" };

  // We use fprintf() instead of cerr because we want this to work at static
  // initialization time.
  fprintf(stderr, "[libprotobuf %s %s:%d] %s\n",
          level_names[level], filename, line, message.c_str());
  fflush(stderr);  // Needed on MSVC.
}